

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::generateRandomConfig
          (IterationConfig *__return_storage_ptr__,BBoxRenderCase *this,int seed,
          IVec2 *renderTargetSize)

{
  undefined8 uVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  Random rnd;
  deRandom local_38;
  
  deRandom_init(&local_38,seed);
  IterationConfig::IterationConfig(__return_storage_ptr__);
  iVar2 = renderTargetSize->m_data[0];
  if (0x1ff < iVar2) {
    iVar2 = 0x200;
  }
  iVar2 = de::Random::getInt((Random *)&local_38,0x100,iVar2);
  (__return_storage_ptr__->viewportSize).m_data[0] = iVar2;
  iVar2 = 0x200;
  if (renderTargetSize->m_data[1] < 0x200) {
    iVar2 = renderTargetSize->m_data[1];
  }
  iVar2 = de::Random::getInt((Random *)&local_38,0x100,iVar2);
  (__return_storage_ptr__->viewportSize).m_data[1] = iVar2;
  iVar2 = de::Random::getInt((Random *)&local_38,0,
                             renderTargetSize->m_data[0] -
                             (__return_storage_ptr__->viewportSize).m_data[0]);
  (__return_storage_ptr__->viewportPos).m_data[0] = iVar2;
  iVar2 = de::Random::getInt((Random *)&local_38,0,
                             renderTargetSize->m_data[1] -
                             (__return_storage_ptr__->viewportSize).m_data[1]);
  (__return_storage_ptr__->viewportPos).m_data[1] = iVar2;
  fVar3 = deRandom_getFloat(&local_38);
  (__return_storage_ptr__->patternSize).m_data[0] = fVar3 + 0.4;
  fVar3 = deRandom_getFloat(&local_38);
  (__return_storage_ptr__->patternSize).m_data[1] = fVar3 + 0.4;
  fVar3 = (__return_storage_ptr__->patternSize).m_data[0];
  fVar4 = deRandom_getFloat(&local_38);
  (__return_storage_ptr__->patternPos).m_data[0] = fVar4 * ((1.0 - fVar3) + 1.0) + -1.0;
  fVar3 = (__return_storage_ptr__->patternSize).m_data[1];
  fVar4 = deRandom_getFloat(&local_38);
  fVar4 = fVar4 * ((1.0 - fVar3) + 1.0) + -1.0;
  (__return_storage_ptr__->patternPos).m_data[1] = fVar4;
  fVar3 = (__return_storage_ptr__->patternPos).m_data[0];
  (__return_storage_ptr__->bbox).min.m_data[0] = fVar3;
  (__return_storage_ptr__->bbox).min.m_data[1] = fVar4;
  uVar1 = *(undefined8 *)(__return_storage_ptr__->patternSize).m_data;
  (__return_storage_ptr__->bbox).min.m_data[2] = 0.0;
  (__return_storage_ptr__->bbox).min.m_data[3] = 1.0;
  (__return_storage_ptr__->bbox).max.m_data[0] = fVar3 + (float)uVar1;
  (__return_storage_ptr__->bbox).max.m_data[1] = fVar4 + (float)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->bbox).max.m_data[2] = 0.0;
  (__return_storage_ptr__->bbox).max.m_data[3] = 1.0;
  if (this->m_bboxSize == BBOXSIZE_SMALLER) {
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).min.m_data[0] =
         fVar3 * 0.4 * (__return_storage_ptr__->patternSize).m_data[0] +
         (__return_storage_ptr__->bbox).min.m_data[0];
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).min.m_data[1] =
         fVar3 * 0.4 * (__return_storage_ptr__->patternSize).m_data[1] +
         (__return_storage_ptr__->bbox).min.m_data[1];
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).max.m_data[0] =
         fVar3 * -0.4 * (__return_storage_ptr__->patternSize).m_data[0] +
         (__return_storage_ptr__->bbox).max.m_data[0];
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).max.m_data[1] =
         fVar3 * -0.4 * (__return_storage_ptr__->patternSize).m_data[1] +
         (__return_storage_ptr__->bbox).max.m_data[1];
  }
  else if (this->m_bboxSize == BBOXSIZE_LARGER) {
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).min.m_data[0] =
         (__return_storage_ptr__->bbox).min.m_data[0] - fVar3 * 0.5;
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).min.m_data[1] =
         (__return_storage_ptr__->bbox).min.m_data[1] - fVar3 * 0.5;
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).min.m_data[2] =
         (__return_storage_ptr__->bbox).min.m_data[2] - fVar3 * 0.5;
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).max.m_data[0] =
         fVar3 * 0.5 + (__return_storage_ptr__->bbox).max.m_data[0];
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).max.m_data[1] =
         fVar3 * 0.5 + (__return_storage_ptr__->bbox).max.m_data[1];
    fVar3 = deRandom_getFloat(&local_38);
    (__return_storage_ptr__->bbox).max.m_data[2] =
         fVar3 * 0.5 + (__return_storage_ptr__->bbox).max.m_data[2];
  }
  return __return_storage_ptr__;
}

Assistant:

BBoxRenderCase::IterationConfig BBoxRenderCase::generateRandomConfig (int seed, const tcu::IVec2& renderTargetSize) const
{
	de::Random		rnd		(seed);
	IterationConfig	config;

	// viewport config
	config.viewportSize.x()	= rnd.getInt(MIN_VIEWPORT_SIZE, de::min<int>(renderTargetSize.x(), MAX_VIEWPORT_SIZE));
	config.viewportSize.y()	= rnd.getInt(MIN_VIEWPORT_SIZE, de::min<int>(renderTargetSize.y(), MAX_VIEWPORT_SIZE));
	config.viewportPos.x()	= rnd.getInt(0, renderTargetSize.x() - config.viewportSize.x());
	config.viewportPos.y()	= rnd.getInt(0, renderTargetSize.y() - config.viewportSize.y());

	// pattern location inside viewport
	config.patternSize.x()	= rnd.getFloat(0.4f, 1.4f);
	config.patternSize.y()	= rnd.getFloat(0.4f, 1.4f);
	config.patternPos.x()	= rnd.getFloat(-1.0f, 1.0f - config.patternSize.x());
	config.patternPos.y()	= rnd.getFloat(-1.0f, 1.0f - config.patternSize.y());

	// accurate bounding box
	config.bbox.min			= tcu::Vec4(config.patternPos.x(), config.patternPos.y(), 0.0f, 1.0f);
	config.bbox.max			= tcu::Vec4(config.patternPos.x() + config.patternSize.x(), config.patternPos.y() + config.patternSize.y(), 0.0f, 1.0f);

	if (m_bboxSize == BBOXSIZE_LARGER)
	{
		// increase bbox size
		config.bbox.min.x() -= rnd.getFloat() * 0.5f;
		config.bbox.min.y() -= rnd.getFloat() * 0.5f;
		config.bbox.min.z() -= rnd.getFloat() * 0.5f;

		config.bbox.max.x() += rnd.getFloat() * 0.5f;
		config.bbox.max.y() += rnd.getFloat() * 0.5f;
		config.bbox.max.z() += rnd.getFloat() * 0.5f;
	}
	else if (m_bboxSize == BBOXSIZE_SMALLER)
	{
		// reduce bbox size
		config.bbox.min.x() += rnd.getFloat() * 0.4f * config.patternSize.x();
		config.bbox.min.y() += rnd.getFloat() * 0.4f * config.patternSize.y();

		config.bbox.max.x() -= rnd.getFloat() * 0.4f * config.patternSize.x();
		config.bbox.max.y() -= rnd.getFloat() * 0.4f * config.patternSize.y();
	}

	return config;
}